

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  uint __fd;
  long *plVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int local_30ec;
  int _saved_errno;
  int i;
  int op;
  int fd;
  int nfds;
  int count;
  int nevents;
  int have_signals;
  uint64_t base;
  sigset_t *psigset;
  sigset_t sigset;
  uv__io_t *w;
  QUEUE *q;
  int real_timeout;
  epoll_event e;
  epoll_event *pe;
  epoll_event events [1024];
  int timeout_local;
  uv_loop_t *loop_local;
  
  events[0x3ff].data._4_4_ = timeout;
  if (loop->nfds == 0) {
    if (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      __assert_fail("QUEUE_EMPTY(&loop->watcher_queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0xe0,"void uv__io_poll(uv_loop_t *, int)");
    }
  }
  else {
    memset((void *)((long)&q + 4),0,0xc);
    while (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      plVar1 = (long *)loop->watcher_queue[0];
      *(long *)plVar1[1] = *plVar1;
      *(long *)(*plVar1 + 8) = plVar1[1];
      *plVar1 = (long)plVar1;
      plVar1[1] = (long)plVar1;
      sigset.__val[0xf] = (unsigned_long)(plVar1 + -3);
      if ((int)plVar1[2] == 0) {
        __assert_fail("w->pevents != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xec,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)plVar1[3] < 0) {
        __assert_fail("w->fd >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xed,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)loop->nwatchers <= (int)plVar1[3]) {
        __assert_fail("w->fd < (int) loop->nwatchers",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xee,"void uv__io_poll(uv_loop_t *, int)");
      }
      q._4_4_ = (undefined4)plVar1[2];
      real_timeout = (int)plVar1[3];
      if (*(int *)((long)plVar1 + 0x14) == 0) {
        _saved_errno = 1;
      }
      else {
        _saved_errno = 3;
      }
      iVar4 = epoll_ctl(loop->backend_fd,_saved_errno,(int)plVar1[3],(epoll_event *)((long)&q + 4));
      if (iVar4 != 0) {
        piVar6 = __errno_location();
        if (*piVar6 != 0x11) {
          abort();
        }
        if (_saved_errno != 1) {
          __assert_fail("op == EPOLL_CTL_ADD",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0xff,"void uv__io_poll(uv_loop_t *, int)");
        }
        iVar4 = epoll_ctl(loop->backend_fd,3,*(int *)(sigset.__val[0xf] + 0x30),
                          (epoll_event *)((long)&q + 4));
        if (iVar4 != 0) {
          abort();
        }
      }
      *(undefined4 *)(sigset.__val[0xf] + 0x2c) = *(undefined4 *)(sigset.__val[0xf] + 0x28);
    }
    base = 0;
    if ((loop->flags & 1) != 0) {
      sigemptyset((sigset_t *)&psigset);
      sigaddset((sigset_t *)&psigset,0x1b);
      base = (uint64_t)&psigset;
    }
    if ((int)events[0x3ff].data._4_4_ < -1) {
      __assert_fail("timeout >= -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x110,"void uv__io_poll(uv_loop_t *, int)");
    }
    uVar2 = loop->time;
    fd = 0x30;
    q._0_4_ = events[0x3ff].data.u64._4_4_;
LAB_0089938b:
    do {
      iVar5 = epoll_pwait(loop->backend_fd,(epoll_event *)&pe,0x400,events[0x3ff].data.u64._4_4_,
                          (__sigset_t *)base);
      piVar6 = __errno_location();
      iVar4 = *piVar6;
      uv__update_time(loop);
      piVar6 = __errno_location();
      *piVar6 = iVar4;
      if (iVar5 == 0) {
        if (events[0x3ff].data.u64._4_4_ == -1) {
          __assert_fail("timeout != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x129,"void uv__io_poll(uv_loop_t *, int)");
        }
joined_r0x00899449:
        if (events[0x3ff].data.u64._4_4_ == 0) {
          return;
        }
      }
      else {
        if (iVar5 == -1) {
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            abort();
          }
          if (events[0x3ff].data.u64._4_4_ != -1) goto joined_r0x00899449;
          goto LAB_0089938b;
        }
        bVar3 = false;
        nfds = 0;
        if (loop->watchers == (uv__io_t **)0x0) {
          __assert_fail("loop->watchers != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x145,"void uv__io_poll(uv_loop_t *, int)");
        }
        loop->watchers[loop->nwatchers] = (uv__io_t *)&pe;
        loop->watchers[loop->nwatchers + 1] = (uv__io_t *)(long)iVar5;
        for (local_30ec = 0; local_30ec < iVar5; local_30ec = local_30ec + 1) {
          e.data.ptr = &events[(long)local_30ec + -1].data;
          __fd = *(uint *)((long)&events[(long)local_30ec + -1].data + 4);
          if (__fd != 0xffffffff) {
            if ((int)__fd < 0) {
              __assert_fail("fd >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                            ,0x150,"void uv__io_poll(uv_loop_t *, int)");
            }
            if (loop->nwatchers <= __fd) {
              __assert_fail("(unsigned) fd < loop->nwatchers",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                            ,0x151,"void uv__io_poll(uv_loop_t *, int)");
            }
            sigset.__val[0xf] = (unsigned_long)loop->watchers[(int)__fd];
            if ((uv__io_s *)sigset.__val[0xf] == (uv__io_s *)0x0) {
              epoll_ctl(loop->backend_fd,2,__fd,(epoll_event *)e.data.ptr);
            }
            else {
              *(uint *)e.data.ptr = (((uv__io_s *)sigset.__val[0xf])->pevents | 0x18) & *e.data.ptr;
              if ((*e.data.ptr == 8) || (*e.data.ptr == 0x10)) {
                *(uint *)e.data.ptr =
                     ((uv__io_s *)sigset.__val[0xf])->pevents & 0x2007 | *e.data.ptr;
              }
              if (*e.data.ptr != 0) {
                if ((uv__io_t *)sigset.__val[0xf] == &loop->signal_io_watcher) {
                  bVar3 = true;
                }
                else {
                  (*((uv__io_s *)sigset.__val[0xf])->cb)
                            (loop,(uv__io_s *)sigset.__val[0xf],*e.data.ptr);
                }
                nfds = nfds + 1;
              }
            }
          }
        }
        if (bVar3) {
          (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
        }
        loop->watchers[loop->nwatchers] = (uv__io_t *)0x0;
        loop->watchers[loop->nwatchers + 1] = (uv__io_t *)0x0;
        if (bVar3) {
          return;
        }
        if (nfds != 0) {
          if (iVar5 != 0x400) {
            return;
          }
          fd = fd + -1;
          if (fd == 0) {
            return;
          }
          events[0x3ff].data.u64._4_4_ = 0;
          goto LAB_0089938b;
        }
        if (events[0x3ff].data.u64._4_4_ == 0) {
          return;
        }
        if (events[0x3ff].data.u64._4_4_ == -1) goto LAB_0089938b;
      }
      if ((int)events[0x3ff].data._4_4_ < 1) {
        __assert_fail("timeout > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x19f,"void uv__io_poll(uv_loop_t *, int)");
      }
      q._0_4_ = (int)q - ((int)loop->time - (int)uVar2);
      events[0x3ff].data._4_4_ = (int)q;
    } while (0 < (int)q);
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  /* A bug in kernels < 2.6.37 makes timeouts larger than ~30 minutes
   * effectively infinite on 32 bits architectures.  To avoid blocking
   * indefinitely, we cap the timeout and poll again if necessary.
   *
   * Note that "30 minutes" is a simplification because it depends on
   * the value of CONFIG_HZ.  The magic constant assumes CONFIG_HZ=1200,
   * that being the largest value I have seen in the wild (and only once.)
   */
  static const int max_safe_timeout = 1789569;
  struct epoll_event events[1024];
  struct epoll_event* pe;
  struct epoll_event e;
  int real_timeout;
  QUEUE* q;
  uv__io_t* w;
  sigset_t sigset;
  sigset_t* psigset;
  uint64_t base;
  int have_signals;
  int nevents;
  int count;
  int nfds;
  int fd;
  int op;
  int i;

  if (loop->nfds == 0) {
    assert(QUEUE_EMPTY(&loop->watcher_queue));
    return;
  }

  memset(&e, 0, sizeof(e));

  while (!QUEUE_EMPTY(&loop->watcher_queue)) {
    q = QUEUE_HEAD(&loop->watcher_queue);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);

    w = QUEUE_DATA(q, uv__io_t, watcher_queue);
    assert(w->pevents != 0);
    assert(w->fd >= 0);
    assert(w->fd < (int) loop->nwatchers);

    e.events = w->pevents;
    e.data.fd = w->fd;

    if (w->events == 0)
      op = EPOLL_CTL_ADD;
    else
      op = EPOLL_CTL_MOD;

    /* XXX Future optimization: do EPOLL_CTL_MOD lazily if we stop watching
     * events, skip the syscall and squelch the events after epoll_wait().
     */
    if (epoll_ctl(loop->backend_fd, op, w->fd, &e)) {
      if (errno != EEXIST)
        abort();

      assert(op == EPOLL_CTL_ADD);

      /* We've reactivated a file descriptor that's been watched before. */
      if (epoll_ctl(loop->backend_fd, EPOLL_CTL_MOD, w->fd, &e))
        abort();
    }

    w->events = w->pevents;
  }

  psigset = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    psigset = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  for (;;) {
    /* See the comment for max_safe_timeout for an explanation of why
     * this is necessary.  Executive summary: kernel bug workaround.
     */
    if (sizeof(int32_t) == sizeof(long) && timeout >= max_safe_timeout)
      timeout = max_safe_timeout;

    nfds = epoll_pwait(loop->backend_fd,
                       events,
                       ARRAY_SIZE(events),
                       timeout,
                       psigset);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (timeout == 0)
        return;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno != EINTR)
        abort();

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_signals = 0;
    nevents = 0;

    assert(loop->watchers != NULL);
    loop->watchers[loop->nwatchers] = (void*) events;
    loop->watchers[loop->nwatchers + 1] = (void*) (uintptr_t) nfds;
    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher)
          have_signals = 1;
        else
          w->cb(loop, w, pe->events);

        nevents++;
      }
    }

    if (have_signals != 0)
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);

    loop->watchers[loop->nwatchers] = NULL;
    loop->watchers[loop->nwatchers + 1] = NULL;

    if (have_signals != 0)
      return;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      return;
    }

    if (timeout == 0)
      return;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      return;

    timeout = real_timeout;
  }
}